

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::equals1(void)

{
  string expected;
  string msg;
  Assert local_b0 [2];
  string local_90 [3];
  
  local_90[0]._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_90[0]._M_string_length._0_4_ = 0x3e;
  UnitTests::Assert::Equals<char[6],char[6]>
            ((Assert *)local_90,(char (*) [6])"Hello",(char (*) [6])0x1154d7);
  local_b0[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_b0[0].m_line = 0x3f;
  local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ASSERT_EQUALS should have fired here.","");
  UnitTests::Assert::Fail(local_b0,local_90);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }